

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<wchar_t_*>
fmt::v8::detail::format_decimal<wchar_t,unsigned_int>(wchar_t *out,uint value,int size)

{
  wchar_t *pwVar1;
  undefined2 uVar2;
  bool bVar3;
  wchar_t *pwVar4;
  uint uVar5;
  wchar_t *pwVar6;
  undefined1 uVar8;
  undefined1 auVar7 [16];
  format_decimal_result<wchar_t_*> fVar9;
  
  uVar5 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  if (size < (int)((ulong)value + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar5 * 8)
                  >> 0x20)) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pwVar1 = out + size;
  pwVar4 = pwVar1;
  pwVar6 = pwVar1;
  uVar5 = value;
  if (99 < value) {
    do {
      pwVar4 = pwVar6 + -2;
      uVar5 = value / 100;
      uVar2 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (ulong)(value % 100) * 2);
      uVar8 = (undefined1)((ushort)uVar2 >> 8);
      auVar7 = ZEXT416(CONCAT22((short)(CONCAT13(uVar8,CONCAT12(uVar8,uVar2)) >> 0x10),
                                CONCAT11((char)uVar2,(char)uVar2)));
      auVar7 = pshuflw(auVar7,auVar7,0x60);
      *(ulong *)(pwVar6 + -2) = CONCAT44(auVar7._4_4_ >> 0x18,auVar7._0_4_ >> 0x18);
      bVar3 = 9999 < value;
      pwVar6 = pwVar4;
      value = value / 100;
    } while (bVar3);
  }
  if (uVar5 < 10) {
    pwVar4[-1] = uVar5 | 0x30;
    pwVar4 = pwVar4 + -1;
  }
  else {
    uVar2 = *(undefined2 *)
             (
             "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
             + (ulong)uVar5 * 2);
    uVar8 = (undefined1)((ushort)uVar2 >> 8);
    auVar7 = ZEXT416(CONCAT22((short)(CONCAT13(uVar8,CONCAT12(uVar8,uVar2)) >> 0x10),
                              CONCAT11((char)uVar2,(char)uVar2)));
    auVar7 = pshuflw(auVar7,auVar7,0x60);
    *(ulong *)(pwVar4 + -2) = CONCAT44(auVar7._4_4_ >> 0x18,auVar7._0_4_ >> 0x18);
    pwVar4 = pwVar4 + -2;
  }
  fVar9.end = pwVar1;
  fVar9.begin = pwVar4;
  return fVar9;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}